

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

void cleanupListExtras(atom *alst,xformDatabase *xdb,abrAtomListProc *delAtomProc,void *deletestuff)

{
  atom_t *paVar1;
  atom *local_50;
  xformAtomRecords *xa;
  transformData *xform;
  atom *next;
  atom *prev;
  atom *a;
  void *deletestuff_local;
  abrAtomListProc *delAtomProc_local;
  xformDatabase *xdb_local;
  atom *alst_local;
  
  if ((alst != (atom *)0x0) && (prev = alst, xdb != (xformDatabase *)0x0)) {
    for (; prev != (atom *)0x0; prev = prev->next) {
      prev->mark = 1;
    }
    for (xa = (xformAtomRecords *)xdb->xforms; xa != (xformAtomRecords *)0x0; xa = xa->next) {
      for (local_50 = xa->a; local_50 != (atom *)0x0; local_50 = local_50->next) {
        local_50->nextInBin->mark = 0;
      }
    }
    next = (atom *)0x0;
    prev = alst;
    while (prev != (atom *)0x0) {
      paVar1 = prev->next;
      if (prev->mark == 0) {
        next = prev;
        prev = paVar1;
      }
      else {
        (*delAtomProc)(prev,deletestuff);
        prev = paVar1;
        if (next != (atom *)0x0) {
          next->next = paVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void cleanupListExtras(atom *alst, xformDatabase* xdb,
            abrAtomListProc delAtomProc, void *deletestuff) {

   atom *a = NULL, *prev= NULL, *next = NULL;
   transformData *xform = NULL;
   xformAtomRecords *xa = NULL;

   if (alst && xdb) {
      /* mark everything in the atom list */
      for(a = alst; a; a = a->next) {
	 a->mark = 1;
      }

      /* unmark atoms reachable from the transformation database */
      for(xform = xdb->xforms; xform; xform = xform->next) {
	 for(xa = xform->recs; xa; xa = xa->next) {
	    xa->a->mark = 0;
	 }
      }

      /* if still marked - must be extra - delete it */
      prev = NULL;
      for(a = alst; a; a = next) {
	 next = a->next;
	 if (a->mark) {
	    delAtomProc(a, deletestuff);
	    if (prev) { prev->next = next; }
	 }
	 else { prev = a; }
      }
   }
}